

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O2

optional<pbrt::BSDFSample> * __thiscall
pbrt::MeasuredBxDF::Sample_f
          (optional<pbrt::BSDFSample> *__return_storage_ptr__,MeasuredBxDF *this,Vector3f wo,
          Float uc,Point2f u,TransportMode mode,BxDFReflTransFlags sampleFlags)

{
  bool bVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  int iVar4;
  long lVar5;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar9 [64];
  undefined1 auVar15 [56];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined4 extraout_XMM0_Db;
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined4 in_XMM1_Db;
  undefined4 uVar17;
  undefined4 in_XMM1_Dd;
  undefined4 uVar18;
  undefined1 auVar16 [16];
  undefined1 auVar19 [16];
  undefined8 in_XMM3_Qb;
  PLSample PVar20;
  Vector3f VVar21;
  SampledSpectrum fr;
  Float params_fr [3];
  Float params [2];
  Tuple3<pbrt::Vector3,_float> local_108;
  undefined1 local_f8 [16];
  float local_e0;
  float local_dc;
  undefined1 local_d8 [16];
  SampledSpectrum local_c0;
  Tuple3<pbrt::Vector3,_float> local_b0;
  Float local_a4;
  float local_a0;
  float local_9c;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  float local_60;
  undefined4 local_5c;
  undefined1 local_58 [16];
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined1 extraout_var [60];
  
  local_48 = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar9._8_56_ = wo._8_56_;
  auVar9._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_f8 = auVar9._0_16_;
  local_108._0_8_ = vmovlps_avx(local_f8);
  if ((sampleFlags & Reflection) != Unset) {
    local_78._8_8_ = in_XMM3_Qb;
    local_78._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
    local_108.z = local_48;
    if (local_48 <= 0.0) {
      local_f8._0_8_ = auVar9._0_8_ ^ 0x8000000080000000;
      local_f8._8_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z ^ 0x80000000;
      local_f8._12_4_ = wo._12_4_ ^ 0x80000000;
      local_108.z = -local_48;
      local_108._0_8_ = vmovlps_avx(local_f8);
    }
    uStack_40 = 0;
    uStack_44 = in_XMM1_Db;
    uStack_3c = in_XMM1_Dd;
    local_d8._0_4_ = SafeACos(local_108.z);
    auVar6 = vmovshdup_avx(local_f8);
    local_60 = atan2f(auVar6._0_4_,local_f8._0_4_);
    local_f8._0_4_ = local_60;
    auVar6 = vpermilps_avx(local_78,0xe1);
    auVar15 = ZEXT856(auVar6._8_8_);
    local_5c = local_d8._0_4_;
    PVar20 = PiecewiseLinear2D<2UL>::Sample(&this->brdf->luminance,(Vector2f)auVar6._0_8_,&local_60)
    ;
    local_dc = PVar20.pdf;
    auVar10._0_8_ = PVar20.p.super_Tuple2<pbrt::Vector2,_float>;
    auVar10._8_56_ = auVar15;
    local_78 = auVar10._0_16_;
    PVar20 = PiecewiseLinear2D<2UL>::Sample(&this->brdf->vndf,auVar10._0_8_,&local_60);
    local_e0 = PVar20.pdf;
    auVar11._0_8_ = PVar20.p.super_Tuple2<pbrt::Vector2,_float>;
    auVar11._8_56_ = auVar15;
    local_58 = auVar11._0_16_;
    auVar6 = vmovshdup_avx(local_58);
    local_98._0_4_ =
         PVar20.p.super_Tuple2<pbrt::Vector2,_float>.x *
         PVar20.p.super_Tuple2<pbrt::Vector2,_float>.x * 1.5707964;
    auVar6 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),auVar6,ZEXT416(0xbf800000));
    fVar7 = auVar6._0_4_ * 3.1415927;
    bVar1 = this->brdf->isotropic;
    local_88 = ZEXT416((uint)(bVar1 & 1) * (int)(fVar7 + (float)local_f8._0_4_) +
                       (uint)!(bool)(bVar1 & 1) * (int)fVar7);
    fVar7 = sinf((float)local_98._0_4_);
    fVar8 = cosf((float)local_98._0_4_);
    auVar15 = (undefined1  [56])0x0;
    uVar17 = extraout_XMM0_Db;
    uVar18 = extraout_XMM0_Dd;
    VVar21 = SphericalDirection(fVar7,fVar8,(Float)local_88._0_4_);
    local_b0.z = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar12._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar12._8_56_ = auVar15;
    local_b0._0_8_ = vmovlps_avx(auVar12._0_16_);
    VVar21 = Reflect((Vector3f *)&local_108,(Vector3f *)&local_b0);
    auVar13._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar13._8_56_ = auVar15;
    if (0.0 < VVar21.super_Tuple3<pbrt::Vector3,_float>.z) {
      local_98 = auVar13._0_16_;
      local_88._4_4_ = uVar17;
      local_88._0_4_ = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
      local_88._8_4_ = 0;
      local_88._12_4_ = uVar18;
      SampledSpectrum::SampledSpectrum(&local_c0,0.0);
      for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
        local_a4 = (Float)local_f8._0_4_;
        local_a0 = (float)local_d8._0_4_;
        local_9c = (this->lambda).lambda.values[lVar5];
        fVar8 = PiecewiseLinear2D<3UL>::Evaluate
                          (&this->brdf->spectra,(Vector2f)local_78._0_8_,&local_a4);
        local_c0.values.values[lVar5] = fVar8;
        if ((Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
             ::reg == '\0') &&
           (iVar4 = __cxa_guard_acquire(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                         ::reg), iVar4 != 0)) {
          StatRegisterer::StatRegisterer
                    ((StatRegisterer *)
                     &Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                      ::reg,Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                            ::StatsAccumulator__,(PixelAccumFunc)0x0);
          __cxa_guard_release(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                               ::reg);
        }
        fVar8 = local_c0.values.values[lVar5];
        *(long *)(in_FS_OFFSET + -0x60) = *(long *)(in_FS_OFFSET + -0x60) + 1;
        if (fVar8 < 0.0) {
          *(long *)(in_FS_OFFSET + -0x68) = *(long *)(in_FS_OFFSET + -0x68) + 1;
        }
        auVar6 = vmaxss_avx(ZEXT416((uint)fVar8),ZEXT416(0));
        local_c0.values.values[lVar5] = auVar6._0_4_;
      }
      fVar8 = (float)local_d8._0_4_ * 0.63661975;
      if (fVar8 < 0.0) {
        auVar14._0_4_ = sqrtf(fVar8);
        auVar14._4_60_ = extraout_var;
        auVar6 = auVar14._0_16_;
      }
      else {
        auVar6 = vsqrtss_avx(ZEXT416((uint)fVar8),ZEXT416((uint)fVar8));
      }
      auVar16._0_4_ = ((float)local_f8._0_4_ + 3.1415927) / 6.2831855;
      auVar16._4_12_ = SUB6012((undefined1  [60])0x0,0);
      local_d8 = vinsertps_avx(auVar6,auVar16,0x10);
      fVar8 = PiecewiseLinear2D<0UL>::Evaluate(&this->brdf->ndf,(Vector2f)local_58._0_8_,&local_60);
      local_f8._0_4_ = fVar8;
      fVar8 = PiecewiseLinear2D<0UL>::Evaluate
                        (&this->brdf->sigma,(Vector2f)local_d8._0_8_,&local_60);
      auVar6._8_4_ = 0x7fffffff;
      auVar6._0_8_ = 0x7fffffff7fffffff;
      auVar6._12_4_ = 0x7fffffff;
      auVar6 = vandps_avx512vl(local_88,auVar6);
      SampledSpectrum::operator*=(&local_c0,(float)local_f8._0_4_ / (auVar6._0_4_ * fVar8 * 4.0));
      auVar3._4_4_ = uStack_44;
      auVar3._0_4_ = local_48;
      auVar3._8_4_ = uStack_40;
      auVar3._12_4_ = uStack_3c;
      auVar6 = vfmadd231ss_fma(ZEXT416((uint)(local_108.y * local_b0.y)),ZEXT416((uint)local_108.x),
                               ZEXT416((uint)local_b0.x));
      auVar16 = vfmadd132ss_fma(ZEXT416((uint)local_108.z),auVar6,ZEXT416((uint)local_b0.z));
      auVar6 = vmaxss_avx(SUB6416(ZEXT464(0x358637bd),0),
                          ZEXT416((uint)((float)local_58._0_4_ * 19.73921 * fVar7)));
      if (local_48 <= 0.0) {
        auVar19._0_8_ = local_98._0_8_ ^ 0x8000000080000000;
        auVar19._8_4_ = local_98._8_4_ ^ 0x80000000;
        auVar19._12_4_ = local_98._12_4_ ^ 0x80000000;
        local_98 = auVar19;
      }
      uVar2 = vcmpss_avx512f(auVar3,ZEXT816(0) << 0x40,2);
      bVar1 = (bool)((byte)uVar2 & 1);
      __return_storage_ptr__->set = true;
      *(undefined8 *)&__return_storage_ptr__->optionalValue = local_c0.values.values._0_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) =
           local_c0.values.values._8_8_;
      uVar2 = vmovlps_avx(local_98);
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar2;
      *(uint *)((long)&__return_storage_ptr__->optionalValue + 0x18) =
           (uint)bVar1 * (local_88._0_4_ ^ 0x80000000) + (uint)!bVar1 * local_88._0_4_;
      *(float *)((long)&__return_storage_ptr__->optionalValue + 0x1c) =
           (local_e0 * local_dc) / (auVar6._0_4_ * auVar16._0_4_ * 4.0);
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0x3f80000000000009;
      (__return_storage_ptr__->optionalValue).__data[0x28] = '\0';
      return __return_storage_ptr__;
    }
  }
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
  *(undefined8 *)&__return_storage_ptr__->optionalValue = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<BSDFSample> MeasuredBxDF::Sample_f(Vector3f wo, Float uc, Point2f u,
                                                  TransportMode mode,
                                                  BxDFReflTransFlags sampleFlags) const {
    if (!(sampleFlags & BxDFReflTransFlags::Reflection))
        return {};

    bool flipWi = false;
    if (wo.z <= 0) {
        wo = -wo;
        flipWi = true;
    }

    Float theta_i = SphericalTheta(wo), phi_i = std::atan2(wo.y, wo.x);

    Vector2f sample = Vector2f(u.y, u.x);
    Float params[2] = {phi_i, theta_i};
    auto s = brdf->luminance.Sample(sample, params);
    sample = s.p;
    Float lumPDF = s.pdf;

    s = brdf->vndf.Sample(sample, params);
    Vector2f u_wm = s.p;
    Float ndfPDF = s.pdf;

    Float phi_m = u2phi(u_wm.y), theta_m = u2theta(u_wm.x);
    if (brdf->isotropic)
        phi_m += phi_i;

    /* Spherical -> Cartesian coordinates */
    Float sinTheta_m = std::sin(theta_m), cosTheta_m = std::cos(theta_m);
    Vector3f wm = SphericalDirection(sinTheta_m, cosTheta_m, phi_m);

    Vector3f wi = Reflect(wo, wm);
    if (wi.z <= 0)
        return {};

    SampledSpectrum fr(0);
    for (int i = 0; i < pbrt::NSpectrumSamples; ++i) {
        Float params_fr[3] = {phi_i, theta_i, lambda[i]};
        fr[i] = brdf->spectra.Evaluate(sample, params_fr);
        CHECK_RARE(1e-5f, fr[i] < 0);
        fr[i] = std::max<Float>(0, fr[i]);
    }

    Vector2f u_wo = Vector2f(theta2u(theta_i), phi2u(phi_i));
    fr *= brdf->ndf.Evaluate(u_wm, params) /
          (4 * brdf->sigma.Evaluate(u_wo, params) * AbsCosTheta(wi));

    Float jacobian =
        4 * Dot(wo, wm) * std::max<Float>(2 * Sqr(Pi) * u_wm.x * sinTheta_m, 1e-6f);
    Float pdf = ndfPDF * lumPDF / jacobian;

    if (flipWi)
        wi = -wi;
    return BSDFSample(fr, wi, pdf, BxDFFlags::GlossyReflection);
}